

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

xmlDtdPtr gen_xmlDtdPtr(int no,int nr)

{
  xmlDtdPtr pxVar1;
  
  if (no == 1) {
    if ((api_dtd == (xmlDtdPtr)0x0) || (api_dtd->type != XML_DTD_NODE)) {
      get_api_doc();
      if ((api_doc != (xmlDocPtr)0x0) &&
         ((pxVar1 = (xmlDtdPtr)api_doc->children, pxVar1 != (xmlDtdPtr)0x0 &&
          (pxVar1->type == XML_DTD_NODE)))) {
        api_dtd = pxVar1;
      }
    }
    return api_dtd;
  }
  if (no == 0) {
    pxVar1 = (xmlDtdPtr)xmlNewDtd(0,"dtd","foo","bar");
    return pxVar1;
  }
  return (xmlDtdPtr)0x0;
}

Assistant:

static xmlDtdPtr gen_xmlDtdPtr(int no, int nr ATTRIBUTE_UNUSED) {
    if (no == 0)
        return(xmlNewDtd(NULL, BAD_CAST "dtd", BAD_CAST"foo", BAD_CAST"bar"));
    if (no == 1) return(get_api_dtd());
    return(NULL);
}